

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_int>::resetPool
          (btAxisSweep3Internal<unsigned_int> *this,btDispatcher *param_2)

{
  uint uVar1;
  undefined4 *puVar2;
  ulong uVar3;
  
  if (this->m_numHandles != 0) {
    return;
  }
  this->m_firstFreeHandle = 1;
  uVar1 = this->m_maxHandles;
  if (1 < uVar1) {
    puVar2 = (undefined4 *)&this->m_pHandles[1].super_btBroadphaseProxy.field_0x3c;
    uVar3 = 1;
    do {
      uVar3 = uVar3 + 1;
      *puVar2 = (int)uVar3;
      uVar1 = this->m_maxHandles;
      puVar2 = puVar2 + 0x18;
    } while (uVar3 < uVar1);
  }
  *(undefined4 *)&this->m_pHandles[uVar1 - 1].super_btBroadphaseProxy.field_0x3c = 0;
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::resetPool(btDispatcher* /*dispatcher*/)
{
	if (m_numHandles == 0)
	{
		m_firstFreeHandle = 1;
		{
			for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < m_maxHandles; i++)
				m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
			m_pHandles[m_maxHandles - 1].SetNextFree(0);
		}
	}
}